

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O3

int Fra_SmlNodeIsConst(Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = *(long *)((long)(pObj->field_5).pData + 0x38);
  iVar1 = *(int *)(lVar3 + 0x14);
  iVar2 = *(int *)(lVar3 + 0x18);
  if (iVar2 < iVar1) {
    lVar4 = 0;
    do {
      if (*(int *)(lVar3 + (long)(pObj->Id * iVar1) * 4 + (long)iVar2 * 4 + 0x28 + lVar4 * 4) != 0)
      {
        return 0;
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 - iVar2 != (int)lVar4);
  }
  return 1;
}

Assistant:

int Fra_SmlNodeIsConst( Aig_Obj_t * pObj )
{
    Fra_Man_t * p = (Fra_Man_t *)pObj->pData;
    unsigned * pSims;
    int i;
    pSims = Fra_ObjSim(p->pSml, pObj->Id);
    for ( i = p->pSml->nWordsPref; i < p->pSml->nWordsTotal; i++ )
        if ( pSims[i] )
            return 0;
    return 1;
}